

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * inject_top_level_storage_qualifier
                   (string *__return_storage_ptr__,string *expr,string *qualifier)

{
  long lVar1;
  long lVar2;
  string *extraout_RAX;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40 [4];
  
  lVar1 = std::__cxx11::string::rfind((char)expr,0x26);
  lVar2 = std::__cxx11::string::rfind((char)expr,0x2a);
  if ((lVar1 == -1) && (lVar2 == -1)) {
    psVar3 = spirv_cross::
             join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&>
                       (__return_storage_ptr__,(spirv_cross *)qualifier,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x2bb1d1,(char (*) [2])expr,in_R8);
    return psVar3;
  }
  std::__cxx11::string::substr((ulong)local_40,(ulong)expr);
  std::__cxx11::string::substr((ulong)&local_60,(ulong)expr);
  spirv_cross::
  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bb1d1,
             (char (*) [2])qualifier,&local_60,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  psVar3 = (string *)(local_40 + 2);
  if (local_40[0] != psVar3) {
    operator_delete(local_40[0]);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

static string inject_top_level_storage_qualifier(const string &expr, const string &qualifier)
{
	// Easier to do this through text munging since the qualifier does not exist in the type system at all,
	// and plumbing in all that information is not very helpful.
	size_t last_reference = expr.find_last_of('&');
	size_t last_pointer = expr.find_last_of('*');
	size_t last_significant = string::npos;

	if (last_reference == string::npos)
		last_significant = last_pointer;
	else if (last_pointer == string::npos)
		last_significant = last_reference;
	else
		last_significant = max<size_t>(last_reference, last_pointer);

	if (last_significant == string::npos)
		return join(qualifier, " ", expr);
	else
	{
		return join(expr.substr(0, last_significant + 1), " ",
		            qualifier, expr.substr(last_significant + 1, string::npos));
	}
}